

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ech_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl_00;
  bool bVar1;
  uint16_t uVar2;
  Span<const_unsigned_char> SVar3;
  bssl *local_40;
  SSL *ssl;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  if (contents == (CBS *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    uVar2 = ssl_protocol_version(ssl_00);
    if ((uVar2 < 0x304) || (ssl_00->s3->ech_status == ssl_ech_accepted)) {
      *out_alert = 'n';
      ERR_put_error(0x10,0,0xde,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x25e);
      hs_local._7_1_ = false;
    }
    else {
      SVar3 = cbs_st::operator_cast_to_Span(contents);
      local_40 = (bssl *)SVar3.data_;
      SVar3.data_ = SVar3.size_;
      bVar1 = ssl_is_valid_ech_config_list(local_40,SVar3);
      if (bVar1) {
        if (ssl_00->s3->ech_status == ssl_ech_rejected) {
          SVar3 = cbs_st::operator_cast_to_Span(contents);
          bVar1 = Array<unsigned_char>::CopyFrom(&hs->ech_retry_configs,SVar3);
          if (!bVar1) {
            *out_alert = 'P';
            return false;
          }
        }
        hs_local._7_1_ = true;
      }
      else {
        *out_alert = '2';
        hs_local._7_1_ = false;
      }
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ech_parse_serverhello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                      CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents == NULL) {
    return true;
  }

  // The ECH extension may not be sent in TLS 1.2 ServerHello, only TLS 1.3
  // EncryptedExtensions. It also may not be sent in response to an inner ECH
  // extension.
  if (ssl_protocol_version(ssl) < TLS1_3_VERSION ||
      ssl->s3->ech_status == ssl_ech_accepted) {
    *out_alert = SSL_AD_UNSUPPORTED_EXTENSION;
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_EXTENSION);
    return false;
  }

  if (!ssl_is_valid_ech_config_list(*contents)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  if (ssl->s3->ech_status == ssl_ech_rejected &&
      !hs->ech_retry_configs.CopyFrom(*contents)) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  return true;
}